

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChButterworth_Lowpass::Config
          (ChButterworth_Lowpass *this,uint nPoles,double step,double fc)

{
  vector<double,_std::allocator<double>_> *this_00;
  double dVar1;
  undefined1 auVar2 [16];
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  uint uVar14;
  size_type __new_size;
  uint uVar15;
  ulong uVar16;
  size_t i;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  uVar15 = 1;
  if (1 < nPoles) {
    uVar15 = nPoles;
  }
  uVar16 = 6;
  if (uVar15 < 6) {
    uVar16 = (ulong)uVar15;
  }
  this_00 = &this->m_Q;
  this->m_Ts = step;
  uVar15 = (uint)uVar16;
  __new_size = 0;
  if (1 < nPoles) {
    __new_size = uVar16 >> 1;
  }
  uVar14 = uVar15 & 1;
  if (nPoles < 2) {
    uVar14 = 1;
  }
  this->m_n_single = uVar14;
  this->m_n_biquad = (uint)__new_size;
  std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
  if (this->m_n_single == 1) {
    uVar16 = 0;
    while (uVar15 - 1 >> 1 != uVar16) {
      auVar18._0_8_ = (double)(int)(uVar16 + 1);
      auVar18._8_8_ = in_XMM2_Qb;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (double)(int)uVar15;
      auVar13 = vfmadd213sd_fma(auVar18,ZEXT816(0x4000000000000000),auVar2);
      dVar17 = cos(((auVar13._0_8_ + -1.0) * 3.141592653589793) / (double)(int)(uVar15 * 2));
      (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[uVar16] = dVar17 * -2.0;
      uVar16 = uVar16 + 1;
    }
  }
  else {
    uVar16 = (ulong)nPoles + (ulong)(nPoles == 0);
    uVar14 = 6;
    if (uVar16 < 6) {
      uVar14 = (uint)uVar16;
    }
    uVar16 = 0;
    while (uVar14 >> 1 != uVar16) {
      auVar19._0_8_ = (double)(int)(uVar16 + 1);
      auVar19._8_8_ = in_XMM2_Qb;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (double)(int)uVar15;
      auVar13 = vfmadd213sd_fma(auVar19,ZEXT816(0x4000000000000000),auVar13);
      dVar17 = cos(((auVar13._0_8_ + -1.0) * 3.141592653589793) / (double)(int)(uVar15 * 2));
      (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[uVar16] = dVar17 * -2.0;
      uVar16 = uVar16 + 1;
    }
  }
  dVar10 = fc * 6.283185307179586;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a0,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a1,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a2,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b0,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b1,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b2,(ulong)this->m_n_biquad);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar10;
  dVar17 = this->m_Ts;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar17;
  if (this->m_n_single == 1) {
    auVar13 = vfmadd231sd_fma(ZEXT816(0x4000000000000000),auVar20,auVar26);
    auVar19 = vfmadd231sd_fma(ZEXT816(0xc000000000000000),auVar20,auVar26);
    dVar21 = (dVar10 * dVar17) / auVar13._0_8_;
    this->m_b0 = dVar21;
    this->m_b1 = dVar21;
    this->m_a1 = auVar19._0_8_ / auVar13._0_8_;
    this->m_a0 = 1.0;
  }
  uVar15 = this->m_n_biquad;
  pdVar3 = (this->m_biq_b0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->m_biq_b1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->m_biq_b2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->m_Q).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->m_biq_a0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->m_biq_a1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->m_biq_a2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar16 = 0;
  dVar21 = dVar10 * dVar17 * dVar17;
  dVar11 = dVar10 * dVar17 * (dVar17 + dVar17);
  dVar12 = dVar10 * dVar21;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar11;
  auVar13 = vfmadd213sd_fma(auVar23,auVar26,ZEXT816(0xc020000000000000));
  for (; uVar15 != uVar16; uVar16 = uVar16 + 1) {
    pdVar3[uVar16] = dVar12;
    pdVar4[uVar16] = dVar10 * dVar11;
    pdVar5[uVar16] = dVar12;
    dVar1 = pdVar6[uVar16];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar21;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar10 * dVar17 * (dVar1 + dVar1);
    auVar19 = vfmadd231sd_fma(auVar24,auVar22,auVar26);
    pdVar7[uVar16] = auVar19._0_8_ + 4.0;
    pdVar8[uVar16] = auVar13._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar10 * dVar17 * pdVar6[uVar16] * -2.0;
    auVar19 = vfmadd231sd_fma(auVar25,auVar22,auVar26);
    pdVar9[uVar16] = auVar19._0_8_ + 4.0;
    pdVar3[uVar16] = pdVar3[uVar16] / pdVar7[uVar16];
    pdVar4[uVar16] = pdVar4[uVar16] / pdVar7[uVar16];
    pdVar5[uVar16] = pdVar5[uVar16] / pdVar7[uVar16];
    pdVar8[uVar16] = pdVar8[uVar16] / pdVar7[uVar16];
    pdVar9[uVar16] = pdVar9[uVar16] / pdVar7[uVar16];
    pdVar7[uVar16] = 1.0;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_u_hist1,(ulong)uVar15);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_u_hist2,(ulong)this->m_n_biquad)
  ;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_y_hist1,(ulong)this->m_n_biquad)
  ;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_y_hist2,(ulong)this->m_n_biquad)
  ;
  Reset(this);
  return;
}

Assistant:

void ChButterworth_Lowpass::Config(unsigned int nPoles, double step, double fc) {
    const unsigned int nPolesMin = 1;
    const unsigned int nPolesMax = 6;

    m_Ts = step;
    double wc = fc * CH_C_2PI;

    if (nPoles < nPolesMin) {
        nPoles = 1;
    }
    if (nPoles > nPolesMax) {
        nPoles = nPolesMax;
    }

    if (nPoles == 1) {
        m_n_single = 1;
        m_n_biquad = 0;
    } else {
        m_n_biquad = nPoles / 2;
        m_n_single = nPoles % 2;
    }
    m_Q.resize(m_n_biquad);
    if (m_n_single == 1) {
        for (unsigned int k = 1; k <= (nPoles - 1) / 2; k++) {
            m_Q[k - 1] = -2.0 * cos(CH_C_PI * (2.0 * k + nPoles - 1) / (2.0 * nPoles));
        }
    } else {
        for (unsigned int k = 1; k <= nPoles / 2; k++) {
            m_Q[k - 1] = -2.0 * cos(CH_C_PI * (2.0 * k + nPoles - 1) / (2.0 * nPoles));
        }
    }

    m_biq_a0.resize(m_n_biquad);
    m_biq_a1.resize(m_n_biquad);
    m_biq_a2.resize(m_n_biquad);
    m_biq_b0.resize(m_n_biquad);
    m_biq_b1.resize(m_n_biquad);
    m_biq_b2.resize(m_n_biquad);

    double T = m_Ts;

    if (m_n_single == 1) {
        m_b0 = T * wc;
        m_b1 = T * wc;

        m_a0 = T * wc + 2.0;
        m_a1 = T * wc - 2.0;

        m_b0 /= m_a0;
        m_b1 /= m_a0;
        m_a1 /= m_a0;
        m_a0 = 1.0;
    }
    for (size_t i = 0; i < m_n_biquad; i++) {
        m_biq_b0[i] = T * T * wc * wc;
        m_biq_b1[i] = 2.0 * T * T * wc * wc;
        m_biq_b2[i] = T * T * wc * wc;

        m_biq_a0[i] = T * T * wc * wc + 2.0 * m_Q[i] * T * wc + 4.0;
        m_biq_a1[i] = (2.0 * T * T * wc * wc - 8.0);
        m_biq_a2[i] = T * T * wc * wc - 2.0 * m_Q[i] * T * wc + 4.0;

        m_biq_b0[i] /= m_biq_a0[i];
        m_biq_b1[i] /= m_biq_a0[i];
        m_biq_b2[i] /= m_biq_a0[i];

        m_biq_a1[i] /= m_biq_a0[i];
        m_biq_a2[i] /= m_biq_a0[i];
        m_biq_a0[i] = 1.0;
    }
    m_biq_u_hist1.resize(m_n_biquad);
    m_biq_u_hist2.resize(m_n_biquad);
    m_biq_y_hist1.resize(m_n_biquad);
    m_biq_y_hist2.resize(m_n_biquad);

    Reset();
}